

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O3

Locale * icu_63::LocaleUtility::initLocaleFromName(UnicodeString *id,Locale *result)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char buffer [128];
  char local_188 [136];
  Locale local_100;
  
  uVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 1) == 0) {
    uVar4 = (id->fUnion).fFields.fLength;
    uVar5 = (int)(short)uVar1 >> 5;
    if ((short)uVar1 < 0) {
      uVar5 = uVar4;
    }
    if ((int)uVar5 < 0x80) {
      uVar5 = (int)(short)uVar1 >> 5;
      if ((short)uVar1 < 0) {
        uVar5 = uVar4;
      }
      uVar4 = (int)uVar5 >> 0x1f & uVar5;
      uVar4 = UnicodeString::doIndexOf(id,L'@',uVar4,uVar5 - uVar4);
      if ((int)uVar4 < 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        do {
          UnicodeString::extract(id,uVar5,uVar4 - uVar5,local_188 + uVar5,0x80 - uVar5,kInvariant);
          local_188[uVar4] = '@';
          sVar2 = (id->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            uVar3 = (id->fUnion).fFields.fLength;
          }
          else {
            uVar3 = (int)sVar2 >> 5;
          }
          uVar5 = uVar4 + 1;
          uVar4 = uVar5;
          if ((int)uVar3 < (int)uVar5) {
            uVar4 = uVar3;
          }
          uVar4 = UnicodeString::doIndexOf(id,L'@',uVar4,uVar3 - uVar4);
        } while (-1 < (int)uVar4);
      }
      UnicodeString::extract(id,uVar5,0x7fffffff,local_188 + uVar5,0x80 - uVar5,kInvariant);
      Locale::createFromName(&local_100,local_188);
      Locale::operator=(result,&local_100);
      Locale::~Locale(&local_100);
      return result;
    }
  }
  Locale::setToBogus(result);
  return result;
}

Assistant:

Locale&
LocaleUtility::initLocaleFromName(const UnicodeString& id, Locale& result)
{
    enum { BUFLEN = 128 }; // larger than ever needed

    if (id.isBogus() || id.length() >= BUFLEN) {
        result.setToBogus();
    } else {
        /*
         * We need to convert from a UnicodeString to char * in order to
         * create a Locale.
         *
         * Problem: Locale ID strings may contain '@' which is a variant
         * character and cannot be handled by invariant-character conversion.
         *
         * Hack: Since ICU code can handle locale IDs with multiple encodings
         * of '@' (at least for EBCDIC; it's not known to be a problem for
         * ASCII-based systems),
         * we use regular invariant-character conversion for everything else
         * and manually convert U+0040 into a compiler-char-constant '@'.
         * While this compilation-time constant may not match the runtime
         * encoding of '@', it should be one of the encodings which ICU
         * recognizes.
         *
         * There should be only at most one '@' in a locale ID.
         */
        char buffer[BUFLEN];
        int32_t prev, i;
        prev = 0;
        for(;;) {
            i = id.indexOf((UChar)0x40, prev);
            if(i < 0) {
                // no @ between prev and the rest of the string
                id.extract(prev, INT32_MAX, buffer + prev, BUFLEN - prev, US_INV);
                break; // done
            } else {
                // normal invariant-character conversion for text between @s
                id.extract(prev, i - prev, buffer + prev, BUFLEN - prev, US_INV);
                // manually "convert" U+0040 at id[i] into '@' at buffer[i]
                buffer[i] = '@';
                prev = i + 1;
            }
        }
        result = Locale::createFromName(buffer);
    }
    return result;
}